

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

JavascriptString *
Js::LiteralStringWithPropertyStringPtr::CreateEmptyString(JavascriptLibrary *library)

{
  Recycler *pRVar1;
  LiteralStringWithPropertyStringPtr *this;
  TrackAllocData local_38;
  JavascriptLibrary *local_10;
  JavascriptLibrary *library_local;
  
  local_10 = library;
  pRVar1 = JavascriptLibrary::GetRecycler(library);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
             ,0x44);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_38);
  this = (LiteralStringWithPropertyStringPtr *)new<Memory::Recycler>(0x30,pRVar1,0x43c4b0);
  LiteralStringWithPropertyStringPtr(this,L"",0,local_10);
  return (JavascriptString *)this;
}

Assistant:

JavascriptString * LiteralStringWithPropertyStringPtr::CreateEmptyString(JavascriptLibrary *const library)
    {
        return (JavascriptString*) RecyclerNew(library->GetRecycler(), LiteralStringWithPropertyStringPtr, _u(""), 0, library);
    }